

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O2

void __thiscall
glslang::TAllocation::checkGuardBlock(TAllocation *this,uchar *blockMem,uchar val,char *locText)

{
  uchar *puVar1;
  long lVar2;
  char assertMsg [80];
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) {
      return;
    }
    puVar1 = blockMem + lVar2;
    lVar2 = lVar2 + 1;
  } while (*puVar1 == val);
  snprintf(assertMsg,0x50,"PoolAlloc: Damage %s %zu byte allocation at 0x%p\n",locText,this->size,
           this->mem + 0x28);
  __assert_fail("0 && \"PoolAlloc: Damage in guard block\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/PoolAlloc.cpp"
                ,0x9f,
                "void glslang::TAllocation::checkGuardBlock(unsigned char *, unsigned char, const char *) const"
               );
}

Assistant:

void TAllocation::checkGuardBlock(unsigned char*, unsigned char, const char*) const
#endif
{
#ifdef GUARD_BLOCKS
    for (size_t x = 0; x < guardBlockSize; x++) {
        if (blockMem[x] != val) {
            const int maxSize = 80;
            char assertMsg[maxSize];

            // We don't print the assert message.  It's here just to be helpful.
            snprintf(assertMsg, maxSize, "PoolAlloc: Damage %s %zu byte allocation at 0x%p\n",
                      locText, size, data());
            assert(0 && "PoolAlloc: Damage in guard block");
        }
    }
#else
    assert(guardBlockSize == 0);
#endif
}